

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O3

shared_ptr<cpp_client::Base_object> __thiscall
cpp_client::Any::holder2<std::shared_ptr<cpp_client::Base_object>_>::get_ptr
          (holder2<std::shared_ptr<cpp_client::Base_object>_> *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  element_type *in_RDI;
  shared_ptr<cpp_client::Base_object> sVar3;
  shared_ptr<cpp_client::Base_object> sVar4;
  shared_ptr<cpp_client::Base_object> sVar5;
  
  peVar1 = (this->obj_).super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    (in_RDI->super_Delta_mergable)._vptr_Delta_mergable = (_func_int **)0x0;
    (in_RDI->super_Delta_mergable).variable_storage_._M_t.
    super___uniq_ptr_impl<cpp_client::Delta_mergable_delay_variables,_std::default_delete<cpp_client::Delta_mergable_delay_variables>_>
    ._M_t.
    super__Tuple_impl<0UL,_cpp_client::Delta_mergable_delay_variables_*,_std::default_delete<cpp_client::Delta_mergable_delay_variables>_>
    .super__Head_base<0UL,_cpp_client::Delta_mergable_delay_variables_*,_false>._M_head_impl =
         (Delta_mergable_delay_variables *)0x0;
  }
  else {
    (in_RDI->super_Delta_mergable)._vptr_Delta_mergable = (_func_int **)peVar1;
    p_Var2 = (this->obj_).super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (in_RDI->super_Delta_mergable).variable_storage_._M_t.
    super___uniq_ptr_impl<cpp_client::Delta_mergable_delay_variables,_std::default_delete<cpp_client::Delta_mergable_delay_variables>_>
    ._M_t.
    super__Tuple_impl<0UL,_cpp_client::Delta_mergable_delay_variables_*,_std::default_delete<cpp_client::Delta_mergable_delay_variables>_>
    .super__Head_base<0UL,_cpp_client::Delta_mergable_delay_variables_*,_false>._M_head_impl =
         (Delta_mergable_delay_variables *)p_Var2;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded != '\0') {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        sVar3.super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
        sVar3.super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             in_RDI;
        return (shared_ptr<cpp_client::Base_object>)
               sVar3.super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>;
      }
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
      sVar5.super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      sVar5.super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (shared_ptr<cpp_client::Base_object>)
             sVar5.super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>;
    }
  }
  sVar4.super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar4.super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<cpp_client::Base_object>)
         sVar4.super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<Base_object> get_ptr() override
      {
         return overload_things<T>{}.get_ptr(obj_);
      }